

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# angle_axis_rodrigues.cpp
# Opt level: O2

Matrix3d *
eulerAnglesToRotationMatrix(Matrix3d *__return_storage_ptr__,double roll,double pitch,double yaw)

{
  Quaternion<double,_0> q;
  AngleAxisd yawAngle;
  AngleAxisd pitchAngle;
  AngleAxisd rollAngle;
  DenseBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>_>
  local_c8 [32];
  AngleAxis<double> local_a8;
  AngleAxis<double> local_88;
  QuaternionType local_68;
  AngleAxis<double> local_48;
  
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::UnitX();
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,3,1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_48,
             (DenseBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>_>
              *)&local_88);
  local_48.m_angle = roll;
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::UnitY();
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,3,1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_88,
             (DenseBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>_>
              *)&local_a8);
  local_88.m_angle = pitch;
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::UnitZ();
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,3,1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_a8,local_c8);
  local_a8.m_angle = yaw;
  Eigen::AngleAxis<double>::operator*(&local_68,&local_a8,&local_88);
  Eigen::operator*((QuaternionType *)local_c8,&local_68,&local_48);
  Eigen::QuaternionBase<Eigen::Quaternion<double,_0>_>::toRotationMatrix
            ((QuaternionBase<Eigen::Quaternion<double,_0>_> *)local_c8);
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix3d eulerAnglesToRotationMatrix(double roll, double pitch,
                                            double yaw) {
  Eigen::AngleAxisd rollAngle(roll, Eigen::Vector3d::UnitX());
  Eigen::AngleAxisd pitchAngle(pitch, Eigen::Vector3d::UnitY());
  Eigen::AngleAxisd yawAngle(yaw, Eigen::Vector3d::UnitZ());
  Eigen::Quaternion<double> q = yawAngle * pitchAngle * rollAngle;
  Eigen::Matrix3d rotationMatrix = q.matrix();
  return rotationMatrix;
}